

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Url * __thiscall Vault::Transform::getUrl(Url *__return_storage_ptr__,Transform *this,Path *path)

{
  long *plVar1;
  allocator<char> local_41;
  string local_40 [32];
  Path *local_20;
  Path *path_local;
  Transform *this_local;
  
  plVar1 = *(long **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Transform *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/transform/",&local_41);
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Transform::getUrl(const Path &path) {
  return client_.getUrl("/v1/transform/", path);
}